

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveMipsArch(Parser *parser,int flags)

{
  undefined4 in_EDX;
  char *__args_1;
  pointer local_20;
  
  Architecture::setCurrent(&Mips.super_Architecture);
  CMipsArchitecture::SetLoadDelay(&Mips,false,0);
  switch(in_EDX) {
  case 1:
    Mips.Version = MARCH_PSX;
    __args_1 = ".psx";
    break;
  case 2:
    Mips.Version = MARCH_PS2;
    __args_1 = ".ps2";
    break;
  case 3:
    Mips.Version = MARCH_PSP;
    __args_1 = ".psp";
    break;
  case 4:
    Mips.Version = MARCH_N64;
    __args_1 = ".n64";
    break;
  case 5:
    Mips.Version = MARCH_RSP;
    __args_1 = ".rsp";
    break;
  default:
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           parser;
  }
  std::make_unique<ArchitectureCommand,char_const(&)[5],char_const(&)[1]>
            ((char (*) [5])&local_20,(char (*) [1])__args_1);
  (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = local_20;
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveMipsArch(Parser& parser, int flags)
{
	Architecture::setCurrent(Mips);
	Mips.SetLoadDelay(false, 0);

	switch (flags)
	{
	case DIRECTIVE_MIPS_PSX:
		Mips.SetVersion(MARCH_PSX);
		return std::make_unique<ArchitectureCommand>(".psx", "");
	case DIRECTIVE_MIPS_PS2:
		Mips.SetVersion(MARCH_PS2);
		return std::make_unique<ArchitectureCommand>(".ps2", "");
	case DIRECTIVE_MIPS_PSP:
		Mips.SetVersion(MARCH_PSP);
		return std::make_unique<ArchitectureCommand>(".psp", "");
	case DIRECTIVE_MIPS_N64:
		Mips.SetVersion(MARCH_N64);
		return std::make_unique<ArchitectureCommand>(".n64", "");
	case DIRECTIVE_MIPS_RSP:
		Mips.SetVersion(MARCH_RSP);
		return std::make_unique<ArchitectureCommand>(".rsp", "");
	}

	return nullptr;
}